

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_q.cpp
# Opt level: O0

void produer(int p_num)

{
  bool bVar1;
  int local_3c;
  bool ret;
  id iStack_38;
  int i;
  longlong local_30;
  longlong tid;
  __atomic_base<int> local_20;
  int p_num_local;
  undefined4 local_18;
  undefined4 local_14;
  atomic<int> *local_10;
  
  tid._4_4_ = p_num;
  iStack_38 = std::this_thread::get_id();
  local_30 = tid_to_ll(&stack0xffffffffffffffc8);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] [tid:%lld] %d elements should be produced\n","info","produer",0x14,
           local_30,(ulong)tid._4_4_);
  }
  local_3c = 0;
  while (local_3c < (int)tid._4_4_) {
    bVar1 = buffer_queue<int>::push(&g_q,&local_3c);
    if (bVar1) {
      if (1 < pr_level) {
        printf("[%-5s][%s:%d] +++[tid:%lld] produced no.%d element\n","info","produer",0x1f,local_30
               ,(ulong)(local_3c + 1));
      }
      local_10 = &g_p_cnt;
      local_14 = 1;
      local_18 = 5;
      p_num_local = 1;
      LOCK();
      UNLOCK();
      local_20 = g_p_cnt.super___atomic_base<int>._M_i;
      local_3c = local_3c + 1;
      g_p_cnt.super___atomic_base<int>._M_i =
           (__atomic_base<int>)(__atomic_base<int>)(g_p_cnt.super___atomic_base<int>._M_i + 1)._M_i;
    }
    else if (1 < pr_level) {
      printf("[%-5s][%s:%d] ***[tid:%lld] push fail, buffer queue is full\n","info","produer",0x1b,
             local_30);
    }
  }
  return;
}

Assistant:

void produer(int p_num)
{
    long long tid = tid_to_ll(this_thread::get_id());
    PR_INFO("[tid:%lld] %d elements should be produced\n", tid, p_num);
    int i = 0;
    while(i<p_num)
    {
        bool ret = g_q.push(i);
        if(!ret)
        {
            PR_INFO("***[tid:%lld] push fail, buffer queue is full\n", tid);
        }
        else
        {
            PR_INFO("+++[tid:%lld] produced no.%d element\n", tid, i+1);
            g_p_cnt.fetch_add(1);
            i++;
        }
        
    }
}